

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O2

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,int N)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  ulong uVar2;
  
  pvVar1 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::vector<int,std::allocator<int>>>
            ((__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2> *)
             &this->indices_,pvVar1);
  std::vector<int,_std::allocator<int>_>::resize
            ((this->indices_).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(long)N);
  pvVar1 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  for (uVar2 = 0; (uint)(~(N >> 0x1f) & N) != uVar2; uVar2 = uVar2 + 1) {
    (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar2] = (int)uVar2;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->shuffled_indices_,pvVar1);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::setUniformIndices(int N)
{
  indices_.reset( new std::vector<int>() );
  indices_->resize(N);
  for( int i = 0; i < N; ++i )
    (*indices_)[i] = i;
  shuffled_indices_ = *indices_;
}